

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

void soplex::SPxQuicksort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::ElementCompare>
               (Nonzero<double> *keys,int end,ElementCompare *compare,int start,bool type)

{
  Nonzero<double> *pNVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  Nonzero<double> *pNVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  
  if (start + 1 < end) {
    uVar8 = end - 1;
    uVar5 = uVar8 - start;
    if (0x18 < (int)uVar5) {
LAB_001fea3e:
      iVar6 = (uVar5 >> 1) + start;
      pNVar1 = keys + iVar6;
      dVar2 = keys[iVar6].val;
      lVar9 = (long)start;
      lVar11 = -(long)(int)uVar8;
      uVar5 = uVar8;
      uVar13 = start;
      do {
        uVar7 = (ulong)uVar5;
        uVar14 = uVar13;
        if ((type & 1U) == 0) {
          if ((int)uVar13 < (int)uVar8) {
            pNVar10 = keys + (int)uVar13;
            lVar12 = 0;
            do {
              if ((compare->epsiloncompare < ABS(pNVar10->val - dVar2)) && (dVar2 <= pNVar10->val))
              {
                uVar14 = uVar13 - (int)lVar12;
                break;
              }
              lVar12 = lVar12 + -1;
              pNVar10 = pNVar10 + 1;
              uVar14 = uVar8;
            } while (lVar11 + (int)uVar13 != lVar12);
          }
          if (start < (int)uVar5) {
            uVar7 = (ulong)(int)uVar5;
            pNVar10 = keys + uVar7;
            do {
              if ((ABS(pNVar10->val - dVar2) <= compare->epsiloncompare) || (pNVar10->val < dVar2))
              goto LAB_001feb88;
              uVar7 = uVar7 - 1;
              pNVar10 = pNVar10 + -1;
            } while (lVar9 < (long)uVar7);
            goto LAB_001feb86;
          }
        }
        else {
          if ((int)uVar13 < (int)uVar8) {
            pNVar10 = keys + (int)uVar13;
            lVar12 = 0;
            do {
              if ((ABS(pNVar10->val - dVar2) <= compare->epsiloncompare) || (dVar2 <= pNVar10->val))
              {
                uVar14 = uVar13 - (int)lVar12;
                break;
              }
              lVar12 = lVar12 + -1;
              pNVar10 = pNVar10 + 1;
              uVar14 = uVar8;
            } while (lVar11 + (int)uVar13 != lVar12);
          }
          if (start < (int)uVar5) {
            uVar7 = (ulong)(int)uVar5;
            pNVar10 = keys + uVar7;
            do {
              if ((compare->epsiloncompare < ABS(pNVar10->val - dVar2)) && (pNVar10->val < dVar2))
              goto LAB_001feb88;
              uVar7 = uVar7 - 1;
              pNVar10 = pNVar10 + -1;
            } while (lVar9 < (long)uVar7);
LAB_001feb86:
            uVar7 = (ulong)(uint)start;
          }
        }
LAB_001feb88:
        uVar5 = (uint)uVar7;
        if ((int)uVar5 <= (int)uVar14) goto LAB_001febcd;
        dVar3 = keys[(int)uVar14].val;
        iVar6 = keys[(int)uVar14].idx;
        keys[(int)uVar14].idx = keys[(int)uVar5].idx;
        keys[(int)uVar14].val = keys[(int)uVar5].val;
        keys[(int)uVar5].val = dVar3;
        keys[(int)uVar5].idx = iVar6;
        uVar13 = uVar14 + 1;
        uVar5 = uVar5 - 1;
      } while( true );
    }
LAB_001fed2c:
    if (0 < (int)uVar5) {
      SPxShellsort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::ElementCompare>
                (keys,uVar8,compare,start);
      return;
    }
  }
  return;
LAB_001febcd:
  if ((type & 1U) == 0) {
    if (start < (int)uVar5) {
      uVar7 = (ulong)(int)uVar5;
      pNVar10 = keys + uVar7;
      do {
        if ((compare->epsiloncompare < ABS(dVar2 - pNVar10->val)) && (pNVar10->val <= dVar2))
        goto LAB_001fec63;
        uVar7 = uVar7 - 1;
        pNVar10 = pNVar10 + -1;
      } while (lVar9 < (long)uVar7);
      uVar7 = (ulong)(uint)start;
    }
LAB_001fec63:
    uVar5 = (uint)uVar7;
    if (uVar5 == uVar8) {
      dVar2 = keys[(int)uVar5].val;
      iVar6 = keys[(int)uVar5].idx;
      keys[(int)uVar5].idx = pNVar1->idx;
      keys[(int)uVar5].val = pNVar1->val;
      pNVar1->val = dVar2;
      pNVar1->idx = iVar6;
      uVar5 = uVar5 - 1;
    }
  }
  else {
    uVar13 = uVar14;
    if ((int)uVar14 < (int)uVar8) {
      pNVar10 = keys + (int)uVar14;
      lVar9 = 0;
      do {
        if ((compare->epsiloncompare < ABS(dVar2 - pNVar10->val)) && (dVar2 < pNVar10->val)) {
          uVar13 = uVar14 - (int)lVar9;
          break;
        }
        lVar9 = lVar9 + -1;
        pNVar10 = pNVar10 + 1;
        uVar13 = uVar8;
      } while ((long)(int)uVar14 - (long)(int)uVar8 != lVar9);
    }
    uVar14 = uVar13;
    if (uVar14 == start) {
      dVar2 = keys[(int)uVar14].val;
      iVar6 = keys[(int)uVar14].idx;
      keys[(int)uVar14].idx = pNVar1->idx;
      keys[(int)uVar14].val = pNVar1->val;
      pNVar1->val = dVar2;
      pNVar1->idx = iVar6;
      uVar14 = uVar14 + 1;
    }
  }
  if ((int)(uVar8 - uVar14) < (int)(uVar5 - start)) {
    bVar4 = (int)uVar8 <= (int)uVar14;
    uVar13 = uVar5;
    uVar5 = uVar8;
    uVar8 = uVar14;
    uVar14 = start;
    if (bVar4) goto LAB_001fed08;
  }
  else {
    bVar4 = (int)uVar5 <= start;
    uVar13 = uVar8;
    uVar8 = start;
    start = uVar14;
    if (bVar4) goto LAB_001fed08;
  }
  SPxQuicksort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::ElementCompare>
            (keys,uVar5 + 1,compare,uVar8,(bool)(~type & 1));
  start = uVar14;
LAB_001fed08:
  uVar8 = uVar13;
  type = (bool)(type ^ 1);
  uVar5 = uVar8 - start;
  if ((int)uVar5 < 0x19) goto LAB_001fed2c;
  goto LAB_001fea3e;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}